

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFramebufferBlitTests.cpp
# Opt level: O1

int __thiscall
deqp::gles3::Functional::FramebufferBlitTests::init(FramebufferBlitTests *this,EVP_PKEY_CTX *ctx)

{
  deUint32 dVar1;
  deUint32 internalFormat;
  undefined4 uVar2;
  Context *pCVar3;
  long lVar4;
  bool bVar5;
  TextureChannelClass TVar6;
  TextureChannelClass TVar7;
  TestNode *pTVar9;
  undefined8 *puVar10;
  BlitRectCase *pBVar11;
  long *plVar12;
  long lVar13;
  TextureFormat TVar14;
  char *pcVar15;
  FboTestCase *pFVar16;
  BlitDepthStencilCase *pBVar17;
  undefined7 extraout_var;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar18;
  ulong *puVar19;
  size_type *psVar20;
  int *piVar21;
  uint srcBuffers;
  ulong uVar22;
  EVP_PKEY_CTX *ctx_00;
  long lVar23;
  long lVar24;
  bool bVar25;
  IVec4 srcRect_1;
  ulong local_140;
  long lStack_138;
  IVec4 srcRect;
  ulong local_120;
  long lStack_118;
  IVec4 dstRect;
  ulong local_100;
  long lStack_f8;
  string name;
  IVec2 dstSize;
  IVec2 srcSize;
  long local_a0 [2];
  BlitDepthStencilCase *local_90;
  uint local_84;
  long *local_80 [2];
  long local_70 [2];
  long *local_60 [2];
  long local_50 [2];
  long local_40;
  TextureFormat local_38;
  int iVar8;
  
  ctx_00 = (EVP_PKEY_CTX *)this;
  if (init()::copyRects == '\0') {
    init((EVP_PKEY_CTX *)this);
  }
  if (init()::filterConsistencyRects == '\0') {
    init(ctx_00);
  }
  if (init()::swizzles == '\0') {
    init(ctx_00);
  }
  srcSize.m_data[0] = 0x7f;
  srcSize.m_data[1] = 0x77;
  dstSize.m_data[0] = 0x84;
  dstSize.m_data[1] = 0x80;
  pTVar9 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar9,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"rect",
             "Blit rectangle tests");
  tcu::TestNode::addChild((TestNode *)this,pTVar9);
  pBVar17 = (BlitDepthStencilCase *)0x0;
  do {
    lVar13 = (long)pBVar17 * 0x28;
    lVar23 = 0;
    local_90 = pBVar17;
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&srcRect_1,init::copyRects[(long)pBVar17].name,
                 (allocator<char> *)&dstRect);
      lVar24 = *(long *)((long)init::swizzles[0].srcSwizzle.m_data + lVar23 + -8);
      if (lVar24 == 0) {
        puVar19 = &local_120;
        piVar21 = srcRect.m_data + 2;
        srcRect.m_data._0_8_ = puVar19;
      }
      else {
        local_60[0] = local_50;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"_","");
        puVar10 = (undefined8 *)std::__cxx11::string::append((char *)local_60);
        srcRect.m_data._0_8_ = &local_120;
        puVar19 = puVar10 + 2;
        if ((ulong *)*puVar10 == puVar19) {
          local_120 = *puVar19;
          lStack_118 = puVar10[3];
        }
        else {
          local_120 = *puVar19;
          srcRect.m_data._0_8_ = (ulong *)*puVar10;
        }
        piVar21 = (int *)(puVar10 + 1);
        srcRect.m_data._8_8_ = puVar10[1];
        *puVar10 = puVar19;
      }
      piVar21[0] = 0;
      piVar21[1] = 0;
      *(undefined1 *)puVar19 = 0;
      uVar22 = 0xf;
      if ((ulong *)srcRect_1.m_data._0_8_ != &local_140) {
        uVar22 = local_140;
      }
      if (uVar22 < (ulong)(srcRect.m_data._8_8_ + srcRect_1.m_data._8_8_)) {
        uVar22 = 0xf;
        if ((ulong *)srcRect.m_data._0_8_ != &local_120) {
          uVar22 = local_120;
        }
        if (uVar22 < (ulong)(srcRect.m_data._8_8_ + srcRect_1.m_data._8_8_)) goto LAB_012e2438;
        puVar10 = (undefined8 *)
                  std::__cxx11::string::replace
                            ((ulong)&srcRect,0,(char *)0x0,srcRect_1.m_data._0_8_);
      }
      else {
LAB_012e2438:
        puVar10 = (undefined8 *)
                  std::__cxx11::string::_M_append((char *)&srcRect_1,srcRect.m_data._0_8_);
      }
      name._M_dataplus._M_p = (pointer)&name.field_2;
      psVar20 = puVar10 + 2;
      if ((size_type *)*puVar10 == psVar20) {
        name.field_2._M_allocated_capacity = *psVar20;
        name.field_2._8_8_ = puVar10[3];
      }
      else {
        name.field_2._M_allocated_capacity = *psVar20;
        name._M_dataplus._M_p = (pointer)*puVar10;
      }
      name._M_string_length = puVar10[1];
      *puVar10 = psVar20;
      puVar10[1] = 0;
      *(char *)psVar20 = '\0';
      if ((ulong *)srcRect.m_data._0_8_ != &local_120) {
        operator_delete((void *)srcRect.m_data._0_8_,local_120 + 1);
      }
      if ((lVar24 != 0) && (local_60[0] != local_50)) {
        operator_delete(local_60[0],local_50[0] + 1);
      }
      if ((ulong *)srcRect_1.m_data._0_8_ != &local_140) {
        operator_delete((void *)srcRect_1.m_data._0_8_,local_140 + 1);
      }
      srcRect.m_data[1] =
           *(int *)(lVar13 + 0x229d988 +
                   (long)*(int *)((long)init::swizzles[0].srcSwizzle.m_data + lVar23 + 4) * 4);
      srcRect.m_data[0] =
           *(int *)(lVar13 + 0x229d988 +
                   (long)*(int *)((long)init::swizzles[0].srcSwizzle.m_data + lVar23) * 4);
      srcRect.m_data[3] =
           *(int *)(lVar13 + 0x229d988 +
                   (long)*(int *)((long)init::swizzles[0].srcSwizzle.m_data + lVar23 + 0xc) * 4);
      srcRect.m_data[2] =
           *(int *)(lVar13 + 0x229d988 +
                   (long)*(int *)((long)init::swizzles[0].srcSwizzle.m_data + lVar23 + 8) * 4);
      dstRect.m_data[1] =
           *(int *)(lVar13 + 0x229d998 +
                   (long)*(int *)((long)init::swizzles[0].dstSwizzle.m_data + lVar23 + 4) * 4);
      dstRect.m_data[0] =
           *(int *)(lVar13 + 0x229d998 +
                   (long)*(int *)((long)init::swizzles[0].dstSwizzle.m_data + lVar23) * 4);
      dstRect.m_data[3] =
           *(int *)(lVar13 + 0x229d998 +
                   (long)*(int *)((long)init::swizzles[0].dstSwizzle.m_data + lVar23 + 0xc) * 4);
      dstRect.m_data[2] =
           *(int *)(lVar13 + 0x229d998 +
                   (long)*(int *)((long)init::swizzles[0].dstSwizzle.m_data + lVar23 + 8) * 4);
      pBVar11 = (BlitRectCase *)operator_new(0xe0);
      pCVar3 = (this->super_TestCaseGroup).m_context;
      srcRect_1.m_data._0_8_ = &local_140;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&srcRect_1,name._M_dataplus._M_p,
                 name._M_dataplus._M_p + name._M_string_length);
      std::__cxx11::string::append((char *)&srcRect_1);
      BlitRectCase::BlitRectCase
                (pBVar11,pCVar3,(char *)srcRect_1.m_data._0_8_,
                 glcts::fixed_sample_locations_values + 1,0x2600,&srcSize,&srcRect,&dstSize,&dstRect
                 ,8);
      tcu::TestNode::addChild(pTVar9,(TestNode *)pBVar11);
      if ((ulong *)srcRect_1.m_data._0_8_ != &local_140) {
        operator_delete((void *)srcRect_1.m_data._0_8_,local_140 + 1);
      }
      pBVar11 = (BlitRectCase *)operator_new(0xe0);
      pCVar3 = (this->super_TestCaseGroup).m_context;
      srcRect_1.m_data._0_8_ = &local_140;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&srcRect_1,name._M_dataplus._M_p,
                 name._M_dataplus._M_p + name._M_string_length);
      std::__cxx11::string::append((char *)&srcRect_1);
      BlitRectCase::BlitRectCase
                (pBVar11,pCVar3,(char *)srcRect_1.m_data._0_8_,
                 glcts::fixed_sample_locations_values + 1,0x2601,&srcSize,&srcRect,&dstSize,&dstRect
                 ,8);
      tcu::TestNode::addChild(pTVar9,(TestNode *)pBVar11);
      if ((ulong *)srcRect_1.m_data._0_8_ != &local_140) {
        operator_delete((void *)srcRect_1.m_data._0_8_,local_140 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)name._M_dataplus._M_p != &name.field_2) {
        operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
      }
      lVar23 = lVar23 + 0x28;
    } while (lVar23 != 0x118);
    pBVar17 = (BlitDepthStencilCase *)
              ((long)&(local_90->super_FboTestCase).super_TestCase.super_TestCase.super_TestNode.
                      _vptr_TestNode + 1);
  } while (pBVar17 != (BlitDepthStencilCase *)0x3);
  lVar13 = 0;
  do {
    lVar23 = lVar13 * 0x28;
    lVar24 = 0;
    do {
      srcRect.m_data._0_8_ = &local_120;
      std::__cxx11::string::_M_construct<char_const*>((string *)&srcRect,"nearest_consistency_","");
      plVar12 = (long *)std::__cxx11::string::append((char *)&srcRect);
      srcRect_1.m_data._0_8_ = &local_140;
      puVar19 = (ulong *)(plVar12 + 2);
      if ((ulong *)*plVar12 == puVar19) {
        local_140 = *puVar19;
        lStack_138 = plVar12[3];
      }
      else {
        local_140 = *puVar19;
        srcRect_1.m_data._0_8_ = (ulong *)*plVar12;
      }
      srcRect_1.m_data._8_8_ = plVar12[1];
      *plVar12 = (long)puVar19;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      lVar4 = *(long *)((long)init::swizzles[0].srcSwizzle.m_data + lVar24 + -8);
      if (lVar4 == 0) {
        puVar19 = &local_100;
        piVar21 = dstRect.m_data + 2;
        dstRect.m_data._0_8_ = puVar19;
      }
      else {
        local_80[0] = local_70;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"_","");
        puVar10 = (undefined8 *)std::__cxx11::string::append((char *)local_80);
        dstRect.m_data._0_8_ = &local_100;
        puVar19 = puVar10 + 2;
        if ((ulong *)*puVar10 == puVar19) {
          local_100 = *puVar19;
          lStack_f8 = puVar10[3];
        }
        else {
          local_100 = *puVar19;
          dstRect.m_data._0_8_ = (ulong *)*puVar10;
        }
        piVar21 = (int *)(puVar10 + 1);
        dstRect.m_data._8_8_ = puVar10[1];
        *puVar10 = puVar19;
      }
      piVar21[0] = 0;
      piVar21[1] = 0;
      *(undefined1 *)puVar19 = 0;
      uVar22 = 0xf;
      if ((ulong *)srcRect_1.m_data._0_8_ != &local_140) {
        uVar22 = local_140;
      }
      if (uVar22 < (ulong)(dstRect.m_data._8_8_ + srcRect_1.m_data._8_8_)) {
        uVar22 = 0xf;
        if ((ulong *)dstRect.m_data._0_8_ != &local_100) {
          uVar22 = local_100;
        }
        if (uVar22 < (ulong)(dstRect.m_data._8_8_ + srcRect_1.m_data._8_8_)) goto LAB_012e28c1;
        puVar10 = (undefined8 *)
                  std::__cxx11::string::replace
                            ((ulong)&dstRect,0,(char *)0x0,srcRect_1.m_data._0_8_);
      }
      else {
LAB_012e28c1:
        puVar10 = (undefined8 *)
                  std::__cxx11::string::_M_append((char *)&srcRect_1,dstRect.m_data._0_8_);
      }
      name._M_dataplus._M_p = (pointer)&name.field_2;
      psVar20 = puVar10 + 2;
      if ((size_type *)*puVar10 == psVar20) {
        name.field_2._M_allocated_capacity = *psVar20;
        name.field_2._8_8_ = puVar10[3];
      }
      else {
        name.field_2._M_allocated_capacity = *psVar20;
        name._M_dataplus._M_p = (pointer)*puVar10;
      }
      name._M_string_length = puVar10[1];
      *puVar10 = psVar20;
      puVar10[1] = 0;
      *(char *)psVar20 = '\0';
      if ((ulong *)dstRect.m_data._0_8_ != &local_100) {
        operator_delete((void *)dstRect.m_data._0_8_,local_100 + 1);
      }
      if ((lVar4 != 0) && (local_80[0] != local_70)) {
        operator_delete(local_80[0],local_70[0] + 1);
      }
      if ((ulong *)srcRect_1.m_data._0_8_ != &local_140) {
        operator_delete((void *)srcRect_1.m_data._0_8_,local_140 + 1);
      }
      if ((ulong *)srcRect.m_data._0_8_ != &local_120) {
        operator_delete((void *)srcRect.m_data._0_8_,local_120 + 1);
      }
      srcRect_1.m_data[1] =
           *(int *)(lVar23 + 0x229da08 +
                   (long)*(int *)((long)init::swizzles[0].srcSwizzle.m_data + lVar24 + 4) * 4);
      srcRect_1.m_data[0] =
           *(int *)(lVar23 + 0x229da08 +
                   (long)*(int *)((long)init::swizzles[0].srcSwizzle.m_data + lVar24) * 4);
      srcRect_1.m_data[3] =
           *(int *)(lVar23 + 0x229da08 +
                   (long)*(int *)((long)init::swizzles[0].srcSwizzle.m_data + lVar24 + 0xc) * 4);
      srcRect_1.m_data[2] =
           *(int *)(lVar23 + 0x229da08 +
                   (long)*(int *)((long)init::swizzles[0].srcSwizzle.m_data + lVar24 + 8) * 4);
      srcRect.m_data[1] =
           *(int *)(lVar23 + 0x229da18 +
                   (long)*(int *)((long)init::swizzles[0].dstSwizzle.m_data + lVar24 + 4) * 4);
      srcRect.m_data[0] =
           *(int *)(lVar23 + 0x229da18 +
                   (long)*(int *)((long)init::swizzles[0].dstSwizzle.m_data + lVar24) * 4);
      srcRect.m_data[3] =
           *(int *)(lVar23 + 0x229da18 +
                   (long)*(int *)((long)init::swizzles[0].dstSwizzle.m_data + lVar24 + 0xc) * 4);
      srcRect.m_data[2] =
           *(int *)(lVar23 + 0x229da18 +
                   (long)*(int *)((long)init::swizzles[0].dstSwizzle.m_data + lVar24 + 8) * 4);
      pBVar11 = (BlitRectCase *)operator_new(0xe0);
      BlitRectCase::BlitRectCase
                (pBVar11,(this->super_TestCaseGroup).m_context,name._M_dataplus._M_p,
                 "Test consistency of the nearest filter",0x2600,&srcSize,&srcRect_1,&dstSize,
                 &srcRect,1);
      (pBVar11->super_FboTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__FboTestCase_02190ef0;
      tcu::TestNode::addChild(pTVar9,(TestNode *)pBVar11);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)name._M_dataplus._M_p != &name.field_2) {
        operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
      }
      lVar24 = lVar24 + 0x28;
    } while (lVar24 != 0x118);
    lVar13 = lVar13 + 1;
    if (lVar13 == 4) {
      pTVar9 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar9,
                 (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
                 "conversion","Color conversion tests");
      tcu::TestNode::addChild((TestNode *)this,pTVar9);
      lVar13 = 0;
      do {
        dVar1 = init::colorFormats[lVar13];
        lVar23 = 0;
        do {
          TVar14 = glu::mapGLInternalFormat(dVar1);
          TVar6 = tcu::getTextureChannelClass(TVar14.type);
          internalFormat = *(deUint32 *)((long)init::colorFormats + lVar23);
          TVar14 = glu::mapGLInternalFormat(internalFormat);
          TVar7 = tcu::getTextureChannelClass(TVar14.type);
          if ((((TVar6 == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT ||
                TVar6 == TEXTURECHANNELCLASS_FLOATING_POINT) !=
                (TVar7 != TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT &&
                TVar7 != TEXTURECHANNELCLASS_FLOATING_POINT)) &&
              ((TVar6 == TEXTURECHANNELCLASS_SIGNED_INTEGER) !=
               (TVar7 != TEXTURECHANNELCLASS_SIGNED_INTEGER))) &&
             ((TVar6 == TEXTURECHANNELCLASS_UNSIGNED_INTEGER) !=
              (TVar7 != TEXTURECHANNELCLASS_UNSIGNED_INTEGER))) {
            pcVar15 = FboTestUtil::getFormatName(dVar1);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&srcRect,pcVar15,(allocator<char> *)&dstRect);
            plVar12 = (long *)std::__cxx11::string::append((char *)&srcRect);
            srcRect_1.m_data._0_8_ = &local_140;
            puVar19 = (ulong *)(plVar12 + 2);
            if ((ulong *)*plVar12 == puVar19) {
              local_140 = *puVar19;
              lStack_138 = plVar12[3];
            }
            else {
              local_140 = *puVar19;
              srcRect_1.m_data._0_8_ = (ulong *)*plVar12;
            }
            srcRect_1.m_data._8_8_ = plVar12[1];
            *plVar12 = (long)puVar19;
            plVar12[1] = 0;
            *(undefined1 *)(plVar12 + 2) = 0;
            FboTestUtil::getFormatName(internalFormat);
            plVar12 = (long *)std::__cxx11::string::append((char *)&srcRect_1);
            name._M_dataplus._M_p = (pointer)&name.field_2;
            psVar20 = (size_type *)(plVar12 + 2);
            if ((size_type *)*plVar12 == psVar20) {
              name.field_2._M_allocated_capacity = *psVar20;
              name.field_2._8_8_ = plVar12[3];
            }
            else {
              name.field_2._M_allocated_capacity = *psVar20;
              name._M_dataplus._M_p = (pointer)*plVar12;
            }
            name._M_string_length = plVar12[1];
            *plVar12 = (long)psVar20;
            plVar12[1] = 0;
            *(undefined1 *)(plVar12 + 2) = 0;
            if ((ulong *)srcRect_1.m_data._0_8_ != &local_140) {
              operator_delete((void *)srcRect_1.m_data._0_8_,local_140 + 1);
            }
            if ((ulong *)srcRect.m_data._0_8_ != &local_120) {
              operator_delete((void *)srcRect.m_data._0_8_,local_120 + 1);
            }
            pFVar16 = (FboTestCase *)operator_new(0x98);
            FboTestCase::FboTestCase
                      (pFVar16,(this->super_TestCaseGroup).m_context,name._M_dataplus._M_p,
                       glcts::fixed_sample_locations_values + 1,false);
            (pFVar16->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
                 (_func_int **)&PTR__FboTestCase_02191038;
            *(deUint32 *)&pFVar16[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
                 dVar1;
            *(deUint32 *)
             ((long)&pFVar16[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4) =
                 internalFormat;
            pFVar16[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx =
                 (TestContext *)0x710000007f;
            tcu::TestNode::addChild(pTVar9,(TestNode *)pFVar16);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)name._M_dataplus._M_p != &name.field_2) {
              operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
            }
          }
          lVar23 = lVar23 + 4;
        } while (lVar23 != 0x8c);
        lVar13 = lVar13 + 1;
      } while (lVar13 != 0x23);
      pTVar9 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar9,
                 (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
                 "depth_stencil","Depth and stencil blits");
      tcu::TestNode::addChild((TestNode *)this,pTVar9);
      lVar13 = 0;
      do {
        dVar1 = *(deUint32 *)((long)init::depthStencilFormats + lVar13);
        local_40 = lVar13;
        TVar14 = glu::mapGLInternalFormat(dVar1);
        pcVar15 = FboTestUtil::getFormatName(dVar1);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&name,pcVar15,(allocator<char> *)&srcRect_1);
        local_84 = TVar14.order - S;
        bVar25 = local_84 < 2;
        local_38 = TVar14;
        local_90 = (BlitDepthStencilCase *)operator_new(200);
        pCVar3 = (this->super_TestCaseGroup).m_context;
        srcRect_1.m_data._0_8_ = &local_140;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&srcRect_1,name._M_dataplus._M_p,
                   name._M_dataplus._M_p + name._M_string_length);
        std::__cxx11::string::append((char *)&srcRect_1);
        pBVar17 = local_90;
        srcBuffers = (uint)bVar25 << 10 | (uint)((TVar14.order - D & 0xfffffffd) == 0) << 8;
        srcSize.m_data[0] = 0x80;
        srcSize.m_data[1] = 0x80;
        srcRect.m_data[0] = 0;
        srcRect.m_data[1] = 0;
        srcRect.m_data[2] = 0x80;
        srcRect.m_data[3] = 0x80;
        dstSize.m_data[0] = 0x80;
        dstSize.m_data[1] = 0x80;
        dstRect.m_data[0] = 0;
        dstRect.m_data[1] = 0;
        dstRect.m_data[2] = 0x80;
        dstRect.m_data[3] = 0x80;
        BlitDepthStencilCase::BlitDepthStencilCase
                  (local_90,pCVar3,(char *)srcRect_1.m_data._0_8_,
                   glcts::fixed_sample_locations_values + 1,dVar1,srcBuffers,&srcSize,&srcRect,
                   srcBuffers,&dstSize,&dstRect,srcBuffers);
        tcu::TestNode::addChild(pTVar9,(TestNode *)pBVar17);
        if ((ulong *)srcRect_1.m_data._0_8_ != &local_140) {
          operator_delete((void *)srcRect_1.m_data._0_8_,local_140 + 1);
        }
        pBVar17 = (BlitDepthStencilCase *)operator_new(200);
        pCVar3 = (this->super_TestCaseGroup).m_context;
        srcRect_1.m_data._0_8_ = &local_140;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&srcRect_1,name._M_dataplus._M_p,
                   name._M_dataplus._M_p + name._M_string_length);
        std::__cxx11::string::append((char *)&srcRect_1);
        srcSize.m_data[0] = 0x7f;
        srcSize.m_data[1] = 0x77;
        srcRect.m_data[0] = 10;
        srcRect.m_data[1] = 0x1e;
        srcRect.m_data[2] = 100;
        srcRect.m_data[3] = 0x46;
        dstSize.m_data[0] = 0x6f;
        dstSize.m_data[1] = 0x82;
        dstRect.m_data[0] = 0x14;
        dstRect.m_data[1] = 5;
        dstRect.m_data[2] = 0x50;
        dstRect.m_data[3] = 0x82;
        BlitDepthStencilCase::BlitDepthStencilCase
                  (pBVar17,pCVar3,(char *)srcRect_1.m_data._0_8_,
                   glcts::fixed_sample_locations_values + 1,dVar1,srcBuffers,&srcSize,&srcRect,
                   srcBuffers,&dstSize,&dstRect,srcBuffers);
        tcu::TestNode::addChild(pTVar9,(TestNode *)pBVar17);
        if ((ulong *)srcRect_1.m_data._0_8_ != &local_140) {
          operator_delete((void *)srcRect_1.m_data._0_8_,local_140 + 1);
        }
        if (((local_38.order == DS) || (local_38.order == D)) && (local_84 < 2)) {
          pBVar17 = (BlitDepthStencilCase *)operator_new(200);
          pCVar3 = (this->super_TestCaseGroup).m_context;
          srcRect_1.m_data._0_8_ = &local_140;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&srcRect_1,name._M_dataplus._M_p,
                     name._M_dataplus._M_p + name._M_string_length);
          std::__cxx11::string::append((char *)&srcRect_1);
          srcSize.m_data[0] = 0x80;
          srcSize.m_data[1] = 0x80;
          srcRect.m_data[0] = 0;
          srcRect.m_data[1] = 0;
          srcRect.m_data[2] = 0x80;
          srcRect.m_data[3] = 0x80;
          dstSize.m_data[0] = 0x80;
          dstSize.m_data[1] = 0x80;
          dstRect.m_data[0] = 0;
          dstRect.m_data[1] = 0;
          dstRect.m_data[2] = 0x80;
          dstRect.m_data[3] = 0x80;
          BlitDepthStencilCase::BlitDepthStencilCase
                    (pBVar17,pCVar3,(char *)srcRect_1.m_data._0_8_,
                     glcts::fixed_sample_locations_values + 1,dVar1,srcBuffers,&srcSize,&srcRect,
                     srcBuffers,&dstSize,&dstRect,0x100);
          tcu::TestNode::addChild(pTVar9,(TestNode *)pBVar17);
          if ((ulong *)srcRect_1.m_data._0_8_ != &local_140) {
            operator_delete((void *)srcRect_1.m_data._0_8_,local_140 + 1);
          }
          pBVar17 = (BlitDepthStencilCase *)operator_new(200);
          pCVar3 = (this->super_TestCaseGroup).m_context;
          srcRect_1.m_data._0_8_ = &local_140;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&srcRect_1,name._M_dataplus._M_p,
                     name._M_dataplus._M_p + name._M_string_length);
          std::__cxx11::string::append((char *)&srcRect_1);
          srcSize.m_data[0] = 0x80;
          srcSize.m_data[1] = 0x80;
          srcRect.m_data[0] = 0;
          srcRect.m_data[1] = 0;
          srcRect.m_data[2] = 0x80;
          srcRect.m_data[3] = 0x80;
          dstSize.m_data[0] = 0x80;
          dstSize.m_data[1] = 0x80;
          dstRect.m_data[0] = 0;
          dstRect.m_data[1] = 0;
          dstRect.m_data[2] = 0x80;
          dstRect.m_data[3] = 0x80;
          BlitDepthStencilCase::BlitDepthStencilCase
                    (pBVar17,pCVar3,(char *)srcRect_1.m_data._0_8_,
                     glcts::fixed_sample_locations_values + 1,dVar1,srcBuffers,&srcSize,&srcRect,
                     srcBuffers,&dstSize,&dstRect,0x400);
          tcu::TestNode::addChild(pTVar9,(TestNode *)pBVar17);
          if ((ulong *)srcRect_1.m_data._0_8_ != &local_140) {
            operator_delete((void *)srcRect_1.m_data._0_8_,local_140 + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)name._M_dataplus._M_p != &name.field_2) {
          operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
        }
        lVar13 = local_40 + 4;
      } while (lVar13 != 0x18);
      pTVar9 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar9,
                 (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
                 "default_framebuffer","Blits with default framebuffer");
      tcu::TestNode::addChild((TestNode *)this,pTVar9);
      local_90 = (BlitDepthStencilCase *)0x0;
      do {
        dVar1 = init::colorFormats[(long)local_90];
        TVar14 = glu::mapGLInternalFormat(dVar1);
        TVar6 = tcu::getTextureChannelClass(TVar14.type);
        bVar25 = glu::isGLInternalColorFormatFilterable(dVar1);
        bVar5 = glu::isGLInternalColorFormatFilterable(dVar1);
        iVar8 = (int)CONCAT71(extraout_var,bVar5);
        if ((TVar6 < TEXTURECHANNELCLASS_LAST) && (iVar8 = 0x13, (0x13U >> (TVar6 & 0x1f) & 1) != 0)
           ) {
          pFVar16 = (FboTestCase *)operator_new(0x90);
          pCVar3 = (this->super_TestCaseGroup).m_context;
          pcVar15 = FboTestUtil::getFormatName(dVar1);
          FboTestCase::FboTestCase
                    (pFVar16,pCVar3,pcVar15,glcts::fixed_sample_locations_values + 1,false);
          (pFVar16->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
               (_func_int **)&PTR__FboTestCase_02191108;
          *(deUint32 *)&pFVar16[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
               dVar1;
          *(uint *)((long)&pFVar16[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode +
                   4) = bVar25 | 0x2600;
          tcu::TestNode::addChild(pTVar9,(TestNode *)pFVar16);
          lVar13 = 0;
          do {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&name,*(char **)((long)&init::areas[0].name + lVar13),
                       (allocator<char> *)&srcRect_1);
            if ((!bVar5) || (*(int *)((long)&init::areas[0].area + lVar13) != 1)) {
              pFVar16 = (FboTestCase *)operator_new(200);
              pCVar3 = (this->super_TestCaseGroup).m_context;
              pcVar15 = FboTestUtil::getFormatName(dVar1);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&srcSize,pcVar15,(allocator<char> *)&dstSize);
              plVar12 = (long *)std::__cxx11::string::append((char *)&srcSize);
              dstRect.m_data._0_8_ = &local_100;
              puVar19 = (ulong *)(plVar12 + 2);
              if ((ulong *)*plVar12 == puVar19) {
                local_100 = *puVar19;
                lStack_f8 = plVar12[3];
              }
              else {
                local_100 = *puVar19;
                dstRect.m_data._0_8_ = (ulong *)*plVar12;
              }
              dstRect.m_data._8_8_ = plVar12[1];
              *plVar12 = (long)puVar19;
              plVar12[1] = 0;
              *(undefined1 *)(plVar12 + 2) = 0;
              plVar12 = (long *)std::__cxx11::string::_M_append
                                          ((char *)&dstRect,(ulong)name._M_dataplus._M_p);
              srcRect.m_data._0_8_ = &local_120;
              puVar19 = (ulong *)(plVar12 + 2);
              if ((ulong *)*plVar12 == puVar19) {
                local_120 = *puVar19;
                lStack_118 = plVar12[3];
              }
              else {
                local_120 = *puVar19;
                srcRect.m_data._0_8_ = (ulong *)*plVar12;
              }
              srcRect.m_data._8_8_ = plVar12[1];
              *plVar12 = (long)puVar19;
              plVar12[1] = 0;
              *(undefined1 *)(plVar12 + 2) = 0;
              plVar12 = (long *)std::__cxx11::string::append((char *)&srcRect);
              srcRect_1.m_data._0_8_ = &local_140;
              puVar19 = (ulong *)(plVar12 + 2);
              if ((ulong *)*plVar12 == puVar19) {
                local_140 = *puVar19;
                lStack_138 = plVar12[3];
              }
              else {
                local_140 = *puVar19;
                srcRect_1.m_data._0_8_ = (ulong *)*plVar12;
              }
              srcRect_1.m_data._8_8_ = plVar12[1];
              *plVar12 = (long)puVar19;
              plVar12[1] = 0;
              *(undefined1 *)(plVar12 + 2) = 0;
              uVar2 = *(undefined4 *)((long)&init::areas[0].area + lVar13);
              FboTestCase::FboTestCase
                        (pFVar16,pCVar3,(char *)srcRect_1.m_data._0_8_,
                         glcts::fixed_sample_locations_values + 1,false);
              *(deUint32 *)&pFVar16[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
                   dVar1;
              *(undefined8 *)
               ((long)&pFVar16[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4) =
                   0x2600;
              (pFVar16->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
                   (_func_int **)&PTR__FboTestCase_02191170;
              *(undefined4 *)
               ((long)&pFVar16[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx + 4) =
                   uVar2;
              *(undefined4 *)
               &pFVar16[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p =
                   0xffffffff;
              *(undefined4 *)
               ((long)&pFVar16[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus.
                       _M_p + 4) = 0xffffffff;
              *(undefined4 *)
               &pFVar16[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_string_length =
                   0xffffffff;
              *(undefined4 *)
               ((long)&pFVar16[1].super_TestCase.super_TestCase.super_TestNode.m_name.
                       _M_string_length + 4) = 0xffffffff;
              *(undefined4 *)&pFVar16[1].super_TestCase.super_TestCase.super_TestNode.m_name.field_2
                   = 0xffffffff;
              *(undefined4 *)
               ((long)&pFVar16[1].super_TestCase.super_TestCase.super_TestNode.m_name.field_2 + 4) =
                   0xffffffff;
              *(undefined4 *)
               ((long)&pFVar16[1].super_TestCase.super_TestCase.super_TestNode.m_name.field_2 + 8) =
                   0xffffffff;
              *(undefined4 *)
               ((long)&pFVar16[1].super_TestCase.super_TestCase.super_TestNode.m_name.field_2 + 0xc)
                   = 0xffffffff;
              *(undefined4 *)
               &pFVar16[1].super_TestCase.super_TestCase.super_TestNode.m_description._M_dataplus.
                _M_p = 0xffffffff;
              *(undefined4 *)
               ((long)&pFVar16[1].super_TestCase.super_TestCase.super_TestNode.m_description.
                       _M_dataplus._M_p + 4) = 0xffffffff;
              *(undefined4 *)
               &pFVar16[1].super_TestCase.super_TestCase.super_TestNode.m_description.
                _M_string_length = 0xffffffff;
              *(undefined4 *)
               ((long)&pFVar16[1].super_TestCase.super_TestCase.super_TestNode.m_description.
                       _M_string_length + 4) = 0xffffffff;
              tcu::TestNode::addChild(pTVar9,(TestNode *)pFVar16);
              if ((ulong *)srcRect_1.m_data._0_8_ != &local_140) {
                operator_delete((void *)srcRect_1.m_data._0_8_,local_140 + 1);
              }
              if ((ulong *)srcRect.m_data._0_8_ != &local_120) {
                operator_delete((void *)srcRect.m_data._0_8_,local_120 + 1);
              }
              if ((ulong *)dstRect.m_data._0_8_ != &local_100) {
                operator_delete((void *)dstRect.m_data._0_8_,local_100 + 1);
              }
              if (srcSize.m_data != (int  [2])local_a0) {
                operator_delete((void *)srcSize.m_data,local_a0[0] + 1);
              }
              pFVar16 = (FboTestCase *)operator_new(200);
              pCVar3 = (this->super_TestCaseGroup).m_context;
              pcVar15 = FboTestUtil::getFormatName(dVar1);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&srcSize,pcVar15,(allocator<char> *)&dstSize);
              plVar12 = (long *)std::__cxx11::string::append((char *)&srcSize);
              dstRect.m_data._0_8_ = &local_100;
              puVar19 = (ulong *)(plVar12 + 2);
              if ((ulong *)*plVar12 == puVar19) {
                local_100 = *puVar19;
                lStack_f8 = plVar12[3];
              }
              else {
                local_100 = *puVar19;
                dstRect.m_data._0_8_ = (ulong *)*plVar12;
              }
              dstRect.m_data._8_8_ = plVar12[1];
              *plVar12 = (long)puVar19;
              plVar12[1] = 0;
              *(undefined1 *)(plVar12 + 2) = 0;
              plVar12 = (long *)std::__cxx11::string::_M_append
                                          ((char *)&dstRect,(ulong)name._M_dataplus._M_p);
              srcRect.m_data._0_8_ = &local_120;
              puVar19 = (ulong *)(plVar12 + 2);
              if ((ulong *)*plVar12 == puVar19) {
                local_120 = *puVar19;
                lStack_118 = plVar12[3];
              }
              else {
                local_120 = *puVar19;
                srcRect.m_data._0_8_ = (ulong *)*plVar12;
              }
              srcRect.m_data._8_8_ = plVar12[1];
              *plVar12 = (long)puVar19;
              plVar12[1] = 0;
              *(undefined1 *)(plVar12 + 2) = 0;
              plVar12 = (long *)std::__cxx11::string::append((char *)&srcRect);
              srcRect_1.m_data._0_8_ = &local_140;
              puVar19 = (ulong *)(plVar12 + 2);
              if ((ulong *)*plVar12 == puVar19) {
                local_140 = *puVar19;
                lStack_138 = plVar12[3];
              }
              else {
                local_140 = *puVar19;
                srcRect_1.m_data._0_8_ = (ulong *)*plVar12;
              }
              srcRect_1.m_data._8_8_ = plVar12[1];
              *plVar12 = (long)puVar19;
              plVar12[1] = 0;
              *(undefined1 *)(plVar12 + 2) = 0;
              FboTestCase::FboTestCase
                        (pFVar16,pCVar3,(char *)srcRect_1.m_data._0_8_,
                         glcts::fixed_sample_locations_values + 1,false);
              *(deUint32 *)&pFVar16[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
                   dVar1;
              *(undefined8 *)
               ((long)&pFVar16[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4) =
                   0x100002600;
              (pFVar16->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
                   (_func_int **)&PTR__FboTestCase_02191170;
              *(undefined4 *)
               ((long)&pFVar16[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx + 4) =
                   uVar2;
              *(undefined4 *)
               &pFVar16[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p =
                   0xffffffff;
              *(undefined4 *)
               ((long)&pFVar16[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus.
                       _M_p + 4) = 0xffffffff;
              *(undefined4 *)
               &pFVar16[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_string_length =
                   0xffffffff;
              *(undefined4 *)
               ((long)&pFVar16[1].super_TestCase.super_TestCase.super_TestNode.m_name.
                       _M_string_length + 4) = 0xffffffff;
              *(undefined4 *)&pFVar16[1].super_TestCase.super_TestCase.super_TestNode.m_name.field_2
                   = 0xffffffff;
              *(undefined4 *)
               ((long)&pFVar16[1].super_TestCase.super_TestCase.super_TestNode.m_name.field_2 + 4) =
                   0xffffffff;
              *(undefined4 *)
               ((long)&pFVar16[1].super_TestCase.super_TestCase.super_TestNode.m_name.field_2 + 8) =
                   0xffffffff;
              *(undefined4 *)
               ((long)&pFVar16[1].super_TestCase.super_TestCase.super_TestNode.m_name.field_2 + 0xc)
                   = 0xffffffff;
              *(undefined4 *)
               &pFVar16[1].super_TestCase.super_TestCase.super_TestNode.m_description._M_dataplus.
                _M_p = 0xffffffff;
              *(undefined4 *)
               ((long)&pFVar16[1].super_TestCase.super_TestCase.super_TestNode.m_description.
                       _M_dataplus._M_p + 4) = 0xffffffff;
              *(undefined4 *)
               &pFVar16[1].super_TestCase.super_TestCase.super_TestNode.m_description.
                _M_string_length = 0xffffffff;
              *(undefined4 *)
               ((long)&pFVar16[1].super_TestCase.super_TestCase.super_TestNode.m_description.
                       _M_string_length + 4) = 0xffffffff;
              tcu::TestNode::addChild(pTVar9,(TestNode *)pFVar16);
              if ((ulong *)srcRect_1.m_data._0_8_ != &local_140) {
                operator_delete((void *)srcRect_1.m_data._0_8_,local_140 + 1);
              }
              if ((ulong *)srcRect.m_data._0_8_ != &local_120) {
                operator_delete((void *)srcRect.m_data._0_8_,local_120 + 1);
              }
              if ((ulong *)dstRect.m_data._0_8_ != &local_100) {
                operator_delete((void *)dstRect.m_data._0_8_,local_100 + 1);
              }
              if (srcSize.m_data != (int  [2])local_a0) {
                operator_delete((void *)srcSize.m_data,local_a0[0] + 1);
              }
            }
            if (bVar5) {
              pFVar16 = (FboTestCase *)operator_new(200);
              pCVar3 = (this->super_TestCaseGroup).m_context;
              pcVar15 = FboTestUtil::getFormatName(dVar1);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&srcSize,pcVar15,(allocator<char> *)&dstSize);
              plVar12 = (long *)std::__cxx11::string::append((char *)&srcSize);
              dstRect.m_data._0_8_ = &local_100;
              puVar19 = (ulong *)(plVar12 + 2);
              if ((ulong *)*plVar12 == puVar19) {
                local_100 = *puVar19;
                lStack_f8 = plVar12[3];
              }
              else {
                local_100 = *puVar19;
                dstRect.m_data._0_8_ = (ulong *)*plVar12;
              }
              dstRect.m_data._8_8_ = plVar12[1];
              *plVar12 = (long)puVar19;
              plVar12[1] = 0;
              *(undefined1 *)(plVar12 + 2) = 0;
              plVar12 = (long *)std::__cxx11::string::_M_append
                                          ((char *)&dstRect,(ulong)name._M_dataplus._M_p);
              srcRect.m_data._0_8_ = &local_120;
              puVar19 = (ulong *)(plVar12 + 2);
              if ((ulong *)*plVar12 == puVar19) {
                local_120 = *puVar19;
                lStack_118 = plVar12[3];
              }
              else {
                local_120 = *puVar19;
                srcRect.m_data._0_8_ = (ulong *)*plVar12;
              }
              srcRect.m_data._8_8_ = plVar12[1];
              *plVar12 = (long)puVar19;
              plVar12[1] = 0;
              *(undefined1 *)(plVar12 + 2) = 0;
              plVar12 = (long *)std::__cxx11::string::append((char *)&srcRect);
              srcRect_1.m_data._0_8_ = &local_140;
              puVar19 = (ulong *)(plVar12 + 2);
              if ((ulong *)*plVar12 == puVar19) {
                local_140 = *puVar19;
                lStack_138 = plVar12[3];
              }
              else {
                local_140 = *puVar19;
                srcRect_1.m_data._0_8_ = (ulong *)*plVar12;
              }
              srcRect_1.m_data._8_8_ = plVar12[1];
              *plVar12 = (long)puVar19;
              plVar12[1] = 0;
              *(undefined1 *)(plVar12 + 2) = 0;
              uVar2 = *(undefined4 *)((long)&init::areas[0].area + lVar13);
              FboTestCase::FboTestCase
                        (pFVar16,pCVar3,(char *)srcRect_1.m_data._0_8_,
                         glcts::fixed_sample_locations_values + 1,false);
              *(deUint32 *)&pFVar16[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
                   dVar1;
              *(undefined8 *)
               ((long)&pFVar16[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4) =
                   0x2601;
              (pFVar16->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
                   (_func_int **)&PTR__FboTestCase_02191170;
              *(undefined4 *)
               ((long)&pFVar16[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx + 4) =
                   uVar2;
              *(undefined4 *)
               &pFVar16[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p =
                   0xffffffff;
              *(undefined4 *)
               ((long)&pFVar16[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus.
                       _M_p + 4) = 0xffffffff;
              *(undefined4 *)
               &pFVar16[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_string_length =
                   0xffffffff;
              *(undefined4 *)
               ((long)&pFVar16[1].super_TestCase.super_TestCase.super_TestNode.m_name.
                       _M_string_length + 4) = 0xffffffff;
              *(undefined4 *)&pFVar16[1].super_TestCase.super_TestCase.super_TestNode.m_name.field_2
                   = 0xffffffff;
              *(undefined4 *)
               ((long)&pFVar16[1].super_TestCase.super_TestCase.super_TestNode.m_name.field_2 + 4) =
                   0xffffffff;
              *(undefined4 *)
               ((long)&pFVar16[1].super_TestCase.super_TestCase.super_TestNode.m_name.field_2 + 8) =
                   0xffffffff;
              *(undefined4 *)
               ((long)&pFVar16[1].super_TestCase.super_TestCase.super_TestNode.m_name.field_2 + 0xc)
                   = 0xffffffff;
              *(undefined4 *)
               &pFVar16[1].super_TestCase.super_TestCase.super_TestNode.m_description._M_dataplus.
                _M_p = 0xffffffff;
              *(undefined4 *)
               ((long)&pFVar16[1].super_TestCase.super_TestCase.super_TestNode.m_description.
                       _M_dataplus._M_p + 4) = 0xffffffff;
              *(undefined4 *)
               &pFVar16[1].super_TestCase.super_TestCase.super_TestNode.m_description.
                _M_string_length = 0xffffffff;
              *(undefined4 *)
               ((long)&pFVar16[1].super_TestCase.super_TestCase.super_TestNode.m_description.
                       _M_string_length + 4) = 0xffffffff;
              tcu::TestNode::addChild(pTVar9,(TestNode *)pFVar16);
              if ((ulong *)srcRect_1.m_data._0_8_ != &local_140) {
                operator_delete((void *)srcRect_1.m_data._0_8_,local_140 + 1);
              }
              if ((ulong *)srcRect.m_data._0_8_ != &local_120) {
                operator_delete((void *)srcRect.m_data._0_8_,local_120 + 1);
              }
              if ((ulong *)dstRect.m_data._0_8_ != &local_100) {
                operator_delete((void *)dstRect.m_data._0_8_,local_100 + 1);
              }
              if (srcSize.m_data != (int  [2])local_a0) {
                operator_delete((void *)srcSize.m_data,local_a0[0] + 1);
              }
              pFVar16 = (FboTestCase *)operator_new(200);
              pCVar3 = (this->super_TestCaseGroup).m_context;
              pcVar15 = FboTestUtil::getFormatName(dVar1);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&srcSize,pcVar15,(allocator<char> *)&dstSize);
              plVar12 = (long *)std::__cxx11::string::append((char *)&srcSize);
              dstRect.m_data._0_8_ = &local_100;
              puVar19 = (ulong *)(plVar12 + 2);
              if ((ulong *)*plVar12 == puVar19) {
                local_100 = *puVar19;
                lStack_f8 = plVar12[3];
              }
              else {
                local_100 = *puVar19;
                dstRect.m_data._0_8_ = (ulong *)*plVar12;
              }
              dstRect.m_data._8_8_ = plVar12[1];
              *plVar12 = (long)puVar19;
              plVar12[1] = 0;
              *(undefined1 *)(plVar12 + 2) = 0;
              plVar12 = (long *)std::__cxx11::string::_M_append
                                          ((char *)&dstRect,(ulong)name._M_dataplus._M_p);
              srcRect.m_data._0_8_ = &local_120;
              puVar19 = (ulong *)(plVar12 + 2);
              if ((ulong *)*plVar12 == puVar19) {
                local_120 = *puVar19;
                lStack_118 = plVar12[3];
              }
              else {
                local_120 = *puVar19;
                srcRect.m_data._0_8_ = (ulong *)*plVar12;
              }
              srcRect.m_data._8_8_ = plVar12[1];
              *plVar12 = (long)puVar19;
              plVar12[1] = 0;
              *(undefined1 *)(plVar12 + 2) = 0;
              plVar12 = (long *)std::__cxx11::string::append((char *)&srcRect);
              srcRect_1.m_data._0_8_ = &local_140;
              puVar19 = (ulong *)(plVar12 + 2);
              if ((ulong *)*plVar12 == puVar19) {
                local_140 = *puVar19;
                lStack_138 = plVar12[3];
              }
              else {
                local_140 = *puVar19;
                srcRect_1.m_data._0_8_ = (ulong *)*plVar12;
              }
              srcRect_1.m_data._8_8_ = plVar12[1];
              *plVar12 = (long)puVar19;
              plVar12[1] = 0;
              *(undefined1 *)(plVar12 + 2) = 0;
              FboTestCase::FboTestCase
                        (pFVar16,pCVar3,(char *)srcRect_1.m_data._0_8_,
                         glcts::fixed_sample_locations_values + 1,false);
              *(deUint32 *)&pFVar16[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
                   dVar1;
              *(undefined8 *)
               ((long)&pFVar16[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4) =
                   0x100002601;
              (pFVar16->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
                   (_func_int **)&PTR__FboTestCase_02191170;
              *(undefined4 *)
               ((long)&pFVar16[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx + 4) =
                   uVar2;
              *(undefined4 *)
               &pFVar16[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p =
                   0xffffffff;
              *(undefined4 *)
               ((long)&pFVar16[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus.
                       _M_p + 4) = 0xffffffff;
              *(undefined4 *)
               &pFVar16[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_string_length =
                   0xffffffff;
              *(undefined4 *)
               ((long)&pFVar16[1].super_TestCase.super_TestCase.super_TestNode.m_name.
                       _M_string_length + 4) = 0xffffffff;
              *(undefined4 *)&pFVar16[1].super_TestCase.super_TestCase.super_TestNode.m_name.field_2
                   = 0xffffffff;
              *(undefined4 *)
               ((long)&pFVar16[1].super_TestCase.super_TestCase.super_TestNode.m_name.field_2 + 4) =
                   0xffffffff;
              *(undefined4 *)
               ((long)&pFVar16[1].super_TestCase.super_TestCase.super_TestNode.m_name.field_2 + 8) =
                   0xffffffff;
              *(undefined4 *)
               ((long)&pFVar16[1].super_TestCase.super_TestCase.super_TestNode.m_name.field_2 + 0xc)
                   = 0xffffffff;
              *(undefined4 *)
               &pFVar16[1].super_TestCase.super_TestCase.super_TestNode.m_description._M_dataplus.
                _M_p = 0xffffffff;
              *(undefined4 *)
               ((long)&pFVar16[1].super_TestCase.super_TestCase.super_TestNode.m_description.
                       _M_dataplus._M_p + 4) = 0xffffffff;
              *(undefined4 *)
               &pFVar16[1].super_TestCase.super_TestCase.super_TestNode.m_description.
                _M_string_length = 0xffffffff;
              *(undefined4 *)
               ((long)&pFVar16[1].super_TestCase.super_TestCase.super_TestNode.m_description.
                       _M_string_length + 4) = 0xffffffff;
              tcu::TestNode::addChild(pTVar9,(TestNode *)pFVar16);
              if ((ulong *)srcRect_1.m_data._0_8_ != &local_140) {
                operator_delete((void *)srcRect_1.m_data._0_8_,local_140 + 1);
              }
              if ((ulong *)srcRect.m_data._0_8_ != &local_120) {
                operator_delete((void *)srcRect.m_data._0_8_,local_120 + 1);
              }
              if ((ulong *)dstRect.m_data._0_8_ != &local_100) {
                operator_delete((void *)dstRect.m_data._0_8_,local_100 + 1);
              }
              if (srcSize.m_data != (int  [2])local_a0) {
                operator_delete((void *)srcSize.m_data,local_a0[0] + 1);
              }
            }
            paVar18 = &name.field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)name._M_dataplus._M_p != paVar18) {
              operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
              paVar18 = extraout_RAX;
            }
            iVar8 = (int)paVar18;
            lVar13 = lVar13 + 0x10;
          } while (lVar13 == 0x10);
        }
        local_90 = (BlitDepthStencilCase *)((long)local_90 + 1);
      } while (local_90 != (BlitDepthStencilCase *)0x23);
      return iVar8;
    }
  } while( true );
}

Assistant:

void FramebufferBlitTests::init (void)
{
	static const deUint32 colorFormats[] =
	{
		// RGBA formats
		GL_RGBA32I,
		GL_RGBA32UI,
		GL_RGBA16I,
		GL_RGBA16UI,
		GL_RGBA8,
		GL_RGBA8I,
		GL_RGBA8UI,
		GL_SRGB8_ALPHA8,
		GL_RGB10_A2,
		GL_RGB10_A2UI,
		GL_RGBA4,
		GL_RGB5_A1,

		// RGB formats
		GL_RGB8,
		GL_RGB565,

		// RG formats
		GL_RG32I,
		GL_RG32UI,
		GL_RG16I,
		GL_RG16UI,
		GL_RG8,
		GL_RG8I,
		GL_RG8UI,

		// R formats
		GL_R32I,
		GL_R32UI,
		GL_R16I,
		GL_R16UI,
		GL_R8,
		GL_R8I,
		GL_R8UI,

		// GL_EXT_color_buffer_float
		GL_RGBA32F,
		GL_RGBA16F,
		GL_R11F_G11F_B10F,
		GL_RG32F,
		GL_RG16F,
		GL_R32F,
		GL_R16F
	};

	static const deUint32 depthStencilFormats[] =
	{
		GL_DEPTH_COMPONENT32F,
		GL_DEPTH_COMPONENT24,
		GL_DEPTH_COMPONENT16,
		GL_DEPTH32F_STENCIL8,
		GL_DEPTH24_STENCIL8,
		GL_STENCIL_INDEX8
	};

	// .rect
	{
		static const struct
		{
			const char*	name;
			IVec4		srcRect;
			IVec4		dstRect;
		} copyRects[] =
		{
			{ "basic",						IVec4( 10,  20,  65, 100),		IVec4( 45,   5, 100,  85) },
			{ "scale",						IVec4( 10,  20,  65, 100),		IVec4( 25,  30, 125,  94) },
			{ "out_of_bounds",				IVec4(-10, -15, 100,  63),		IVec4( 50,  30, 136, 144) },
		};

		static const struct
		{
			const char*	name;
			IVec4		srcRect;
			IVec4		dstRect;
		} filterConsistencyRects[] =
		{
			{ "mag",						IVec4( 20,  10,  74, 88),		IVec4( 10,  10,  91, 101) },
			{ "min",						IVec4( 10,  20,  78, 100),		IVec4( 20,  20,  71,  80) },
			{ "out_of_bounds_mag",			IVec4( 21,  10,  73, 82),		IVec4( 11,  43, 141, 151) },
			{ "out_of_bounds_min",			IVec4( 11,  21,  77, 97),		IVec4( 80,  82, 135, 139) },
		};

		static const struct
		{
			const char* name;
			IVec4		srcSwizzle;
			IVec4		dstSwizzle;
		} swizzles[] =
		{
			{ DE_NULL,				IVec4(0,1,2,3),	IVec4(0,1,2,3) },
			{ "reverse_src_x",		IVec4(2,1,0,3), IVec4(0,1,2,3) },
			{ "reverse_src_y",		IVec4(0,3,2,1), IVec4(0,1,2,3) },
			{ "reverse_dst_x",		IVec4(0,1,2,3), IVec4(2,1,0,3) },
			{ "reverse_dst_y",		IVec4(0,1,2,3), IVec4(0,3,2,1) },
			{ "reverse_src_dst_x",	IVec4(2,1,0,3), IVec4(2,1,0,3) },
			{ "reverse_src_dst_y",	IVec4(0,3,2,1), IVec4(0,3,2,1) }
		};

		const IVec2 srcSize(127, 119);
		const IVec2 dstSize(132, 128);

		// Blit rectangle tests.
		tcu::TestCaseGroup* rectGroup = new tcu::TestCaseGroup(m_testCtx, "rect", "Blit rectangle tests");
		addChild(rectGroup);
		for (int rectNdx = 0; rectNdx < DE_LENGTH_OF_ARRAY(copyRects); rectNdx++)
		{
			for (int swzNdx = 0; swzNdx < DE_LENGTH_OF_ARRAY(swizzles); swzNdx++)
			{
				string		name	= string(copyRects[rectNdx].name) + (swizzles[swzNdx].name ? (string("_") + swizzles[swzNdx].name) : string());
				IVec4		srcSwz	= swizzles[swzNdx].srcSwizzle;
				IVec4		dstSwz	= swizzles[swzNdx].dstSwizzle;
				IVec4		srcRect	= copyRects[rectNdx].srcRect.swizzle(srcSwz[0], srcSwz[1], srcSwz[2], srcSwz[3]);
				IVec4		dstRect	= copyRects[rectNdx].dstRect.swizzle(dstSwz[0], dstSwz[1], dstSwz[2], dstSwz[3]);

				rectGroup->addChild(new BlitRectCase(m_context, (name + "_nearest").c_str(),	"", GL_NEAREST,	srcSize, srcRect, dstSize, dstRect));
				rectGroup->addChild(new BlitRectCase(m_context, (name + "_linear").c_str(),		"", GL_LINEAR,	srcSize, srcRect, dstSize, dstRect));
			}
		}

		// Nearest filter tests
		for (int rectNdx = 0; rectNdx < DE_LENGTH_OF_ARRAY(filterConsistencyRects); rectNdx++)
		{
			for (int swzNdx = 0; swzNdx < DE_LENGTH_OF_ARRAY(swizzles); swzNdx++)
			{
				string		name	= string("nearest_consistency_") + filterConsistencyRects[rectNdx].name + (swizzles[swzNdx].name ? (string("_") + swizzles[swzNdx].name) : string());
				IVec4		srcSwz	= swizzles[swzNdx].srcSwizzle;
				IVec4		dstSwz	= swizzles[swzNdx].dstSwizzle;
				IVec4		srcRect	= filterConsistencyRects[rectNdx].srcRect.swizzle(srcSwz[0], srcSwz[1], srcSwz[2], srcSwz[3]);
				IVec4		dstRect	= filterConsistencyRects[rectNdx].dstRect.swizzle(dstSwz[0], dstSwz[1], dstSwz[2], dstSwz[3]);

				rectGroup->addChild(new BlitNearestFilterConsistencyCase(m_context, name.c_str(), "Test consistency of the nearest filter", srcSize, srcRect, dstSize, dstRect));
			}
		}
	}

	// .conversion
	{
		tcu::TestCaseGroup* conversionGroup = new tcu::TestCaseGroup(m_testCtx, "conversion", "Color conversion tests");
		addChild(conversionGroup);

		for (int srcFmtNdx = 0; srcFmtNdx < DE_LENGTH_OF_ARRAY(colorFormats); srcFmtNdx++)
		{
			for (int dstFmtNdx = 0; dstFmtNdx < DE_LENGTH_OF_ARRAY(colorFormats); dstFmtNdx++)
			{
				deUint32					srcFormat	= colorFormats[srcFmtNdx];
				tcu::TextureFormat			srcTexFmt	= glu::mapGLInternalFormat(srcFormat);
				tcu::TextureChannelClass	srcType		= tcu::getTextureChannelClass(srcTexFmt.type);
				deUint32					dstFormat	= colorFormats[dstFmtNdx];
				tcu::TextureFormat			dstTexFmt	= glu::mapGLInternalFormat(dstFormat);
				tcu::TextureChannelClass	dstType		= tcu::getTextureChannelClass(dstTexFmt.type);

				if (((srcType == tcu::TEXTURECHANNELCLASS_FLOATING_POINT || srcType == tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) !=
					 (dstType == tcu::TEXTURECHANNELCLASS_FLOATING_POINT || dstType == tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT)) ||
					((srcType == tcu::TEXTURECHANNELCLASS_SIGNED_INTEGER) != (dstType == tcu::TEXTURECHANNELCLASS_SIGNED_INTEGER)) ||
					((srcType == tcu::TEXTURECHANNELCLASS_UNSIGNED_INTEGER) != (dstType == tcu::TEXTURECHANNELCLASS_UNSIGNED_INTEGER)))
					continue; // Conversion not supported.

				string						name		= string(getFormatName(srcFormat)) + "_to_" + getFormatName(dstFormat);

				conversionGroup->addChild(new BlitColorConversionCase(m_context, name.c_str(), "", srcFormat, dstFormat, IVec2(127, 113)));
			}
		}
	}

	// .depth_stencil
	{
		tcu::TestCaseGroup* depthStencilGroup = new tcu::TestCaseGroup(m_testCtx, "depth_stencil", "Depth and stencil blits");
		addChild(depthStencilGroup);

		for (int fmtNdx = 0; fmtNdx < DE_LENGTH_OF_ARRAY(depthStencilFormats); fmtNdx++)
		{
			deUint32			format		= depthStencilFormats[fmtNdx];
			tcu::TextureFormat	texFmt		= glu::mapGLInternalFormat(format);
			string				fmtName		= getFormatName(format);
			bool				depth		= texFmt.order == tcu::TextureFormat::D || texFmt.order == tcu::TextureFormat::DS;
			bool				stencil		= texFmt.order == tcu::TextureFormat::S || texFmt.order == tcu::TextureFormat::DS;
			deUint32			buffers		= (depth ? GL_DEPTH_BUFFER_BIT : 0) | (stencil ? GL_STENCIL_BUFFER_BIT : 0);

			depthStencilGroup->addChild(new BlitDepthStencilCase(m_context, (fmtName + "_basic").c_str(), "", format, buffers, IVec2(128, 128), IVec4(0, 0, 128, 128), buffers, IVec2(128, 128), IVec4(0, 0, 128, 128), buffers));
			depthStencilGroup->addChild(new BlitDepthStencilCase(m_context, (fmtName + "_scale").c_str(), "", format, buffers, IVec2(127, 119), IVec4(10, 30, 100, 70), buffers, IVec2(111, 130), IVec4(20, 5, 80, 130), buffers));

			if (depth && stencil)
			{
				depthStencilGroup->addChild(new BlitDepthStencilCase(m_context, (fmtName + "_depth_only").c_str(),		"", format, buffers, IVec2(128, 128), IVec4(0, 0, 128, 128), buffers, IVec2(128, 128), IVec4(0, 0, 128, 128), GL_DEPTH_BUFFER_BIT));
				depthStencilGroup->addChild(new BlitDepthStencilCase(m_context, (fmtName + "_stencil_only").c_str(),	"", format, buffers, IVec2(128, 128), IVec4(0, 0, 128, 128), buffers, IVec2(128, 128), IVec4(0, 0, 128, 128), GL_STENCIL_BUFFER_BIT));
			}
		}
	}

	// .default_framebuffer
	{
		static const struct
		{
			const char*								name;
			DefaultFramebufferBlitCase::BlitArea	area;
		} areas[] =
		{
			{ "scale",						DefaultFramebufferBlitCase::AREA_SCALE			},
			{ "out_of_bounds",				DefaultFramebufferBlitCase::AREA_OUT_OF_BOUNDS	},
		};

		tcu::TestCaseGroup* defaultFbGroup = new tcu::TestCaseGroup(m_testCtx, "default_framebuffer", "Blits with default framebuffer");
		addChild(defaultFbGroup);

		for (int fmtNdx = 0; fmtNdx < DE_LENGTH_OF_ARRAY(colorFormats); fmtNdx++)
		{
			const deUint32					format		= colorFormats[fmtNdx];
			const tcu::TextureFormat		texFmt		= glu::mapGLInternalFormat(format);
			const tcu::TextureChannelClass	fmtClass	= tcu::getTextureChannelClass(texFmt.type);
			const deUint32					filter		= glu::isGLInternalColorFormatFilterable(format) ? GL_LINEAR : GL_NEAREST;
			const bool						filterable	= glu::isGLInternalColorFormatFilterable(format);

			if (fmtClass != tcu::TEXTURECHANNELCLASS_FLOATING_POINT &&
				fmtClass != tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT &&
				fmtClass != tcu::TEXTURECHANNELCLASS_SIGNED_FIXED_POINT)
				continue; // Conversion not supported.

			defaultFbGroup->addChild(new BlitDefaultFramebufferCase(m_context, getFormatName(format), "", format, filter));

			for (int areaNdx = 0; areaNdx < DE_LENGTH_OF_ARRAY(areas); areaNdx++)
			{
				const string	name				= string(areas[areaNdx].name);
				const bool		addLinear			= filterable;
				const bool		addNearest			= !addLinear || (areas[areaNdx].area != DefaultFramebufferBlitCase::AREA_OUT_OF_BOUNDS); // No need to check out-of-bounds with different filtering

				if (addNearest)
				{
					defaultFbGroup->addChild(new DefaultFramebufferBlitCase(m_context, (std::string(getFormatName(format)) + "_nearest_" + name + "_blit_from_default").c_str(), "", format, GL_NEAREST, DefaultFramebufferBlitCase::BLIT_DEFAULT_TO_TARGET, areas[areaNdx].area));
					defaultFbGroup->addChild(new DefaultFramebufferBlitCase(m_context, (std::string(getFormatName(format)) + "_nearest_" + name + "_blit_to_default").c_str(), "", format, GL_NEAREST, DefaultFramebufferBlitCase::BLIT_TO_DEFAULT_FROM_TARGET, areas[areaNdx].area));
				}

				if (addLinear)
				{
					defaultFbGroup->addChild(new DefaultFramebufferBlitCase(m_context, (std::string(getFormatName(format)) + "_linear_" + name + "_blit_from_default").c_str(), "", format, GL_LINEAR, DefaultFramebufferBlitCase::BLIT_DEFAULT_TO_TARGET, areas[areaNdx].area));
					defaultFbGroup->addChild(new DefaultFramebufferBlitCase(m_context, (std::string(getFormatName(format)) + "_linear_" + name + "_blit_to_default").c_str(), "", format, GL_LINEAR, DefaultFramebufferBlitCase::BLIT_TO_DEFAULT_FROM_TARGET, areas[areaNdx].area));
				}
			}
		}
	}
}